

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

Oop __thiscall
Lodtalk::MethodCompiler::visitBlockExpression(MethodCompiler *this,BlockExpression *node)

{
  Assembler *this_00;
  FunctionalNode *this_01;
  element_type *peVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  SequenceNode *pSVar6;
  Oop OVar7;
  Label *blockEnd;
  undefined4 extraout_var_00;
  vector<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_> *pvVar8;
  LocalVariables *pLVar9;
  size_t sVar10;
  pointer psVar11;
  InstructionNode *pIVar12;
  InstructionNode *pIVar13;
  long lVar14;
  ulong uVar15;
  int arraySize;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  undefined4 extraout_var;
  
  iVar4 = (*(node->super_FunctionalNode).super_Node._vptr_Node[9])(node);
  if ((char)iVar4 == '\0') {
    this_01 = this->localContext;
    this->localContext = &node->super_FunctionalNode;
    this_00 = &this->gen;
    blockEnd = MethodAssembler::Assembler::makeLabel(this_00);
    iVar4 = (*(node->super_FunctionalNode).super_Node._vptr_Node[8])(node);
    if ((ArgumentList *)CONCAT44(extraout_var_00,iVar4) == (ArgumentList *)0x0) {
      uVar18 = 0;
    }
    else {
      pvVar8 = AST::ArgumentList::getArguments((ArgumentList *)CONCAT44(extraout_var_00,iVar4));
      uVar18 = (long)(pvVar8->
                     super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar8->
                     super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3;
    }
    pLVar9 = AST::FunctionalNode::getLocalVariables(&node->super_FunctionalNode);
    psVar11 = (pLVar9->
              super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar14 = (long)(pLVar9->
                   super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar11;
    if (lVar14 == 0) {
      iVar4 = this->temporalVectorCount;
      arraySize = 0;
    }
    else {
      lVar14 = lVar14 >> 4;
      iVar4 = this->temporalVectorCount;
      lVar14 = lVar14 + (ulong)(lVar14 == 0);
      arraySize = 0;
      do {
        peVar1 = (psVar11->
                 super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (peVar1->isCapturedInClosure_ == true) {
          peVar1->temporalVectorIndex = iVar4;
          peVar1->temporalIndex = arraySize;
          arraySize = arraySize + 1;
        }
        psVar11 = psVar11 + 1;
        lVar14 = lVar14 + -1;
      } while (lVar14 != 0);
    }
    if (iVar4 == 0) {
      iVar5 = 0;
    }
    else {
      sVar10 = AST::FunctionalNode::getArgumentCount(this_01);
      iVar5 = this->temporalVectorCount;
      if (0 < iVar5) {
        iVar16 = 0;
        do {
          MethodAssembler::Assembler::pushTemporal(this_00,(int)sVar10 + iVar16);
          iVar16 = iVar16 + 1;
          iVar5 = this->temporalVectorCount;
        } while (iVar16 < iVar5);
      }
    }
    if (arraySize != 0) {
      this->temporalVectorCount = iVar5 + 1;
      iVar4 = iVar4 + 1;
    }
    uVar17 = (ulong)(arraySize != 0);
    psVar11 = (pLVar9->
              super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    lVar14 = (long)(pLVar9->
                   super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)psVar11;
    iVar5 = (int)uVar18;
    if (lVar14 != 0) {
      lVar14 = lVar14 >> 4;
      uVar15 = 0;
      do {
        peVar1 = (psVar11->
                 super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (peVar1->isCapturedInClosure_ == false) {
          if (uVar15 < uVar18) {
            peVar1->temporalIndex = (int)uVar15;
          }
          else {
            peVar1->temporalIndex = iVar4 + iVar5;
            uVar17 = uVar17 + 1;
            iVar4 = iVar4 + 1;
          }
        }
        uVar15 = uVar15 + 1;
        psVar11 = psVar11 + 1;
      } while (lVar14 + (ulong)(lVar14 == 0) != uVar15);
    }
    if (uVar17 != 0) {
      MethodAssembler::Assembler::pushNClosureTemps(this_00,(int)uVar17);
    }
    MethodAssembler::Assembler::pushClosure(this_00,iVar4,iVar5,blockEnd,0);
    if (arraySize != 0) {
      MethodAssembler::Assembler::pushNewArray(this_00,arraySize);
      MethodAssembler::Assembler::popStoreTemporal(this_00,iVar5 + this->temporalVectorCount + -1);
      if (uVar18 != 0) {
        lVar14 = 0;
        uVar17 = 0;
        do {
          psVar11 = (pLVar9->
                    super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          if (*(char *)(*(long *)((long)&(psVar11->
                                         super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr + lVar14) + 0x19) == '\x01') {
            MethodAssembler::Assembler::pushTemporal(this_00,(int)uVar17);
            lVar2 = *(long *)((long)&(psVar11->
                                     super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar14);
            MethodAssembler::Assembler::popStoreTemporalInVector
                      (this_00,*(int *)(lVar2 + 8),*(int *)(lVar2 + 0xc));
          }
          uVar17 = uVar17 + 1;
          lVar14 = lVar14 + 0x10;
        } while (uVar18 != uVar17);
      }
    }
    pIVar12 = MethodAssembler::Assembler::getLastInstruction(this_00);
    pSVar6 = AST::BlockExpression::getBody(node);
    (*(pSVar6->super_Node)._vptr_Node[2])(pSVar6,this);
    bVar3 = MethodAssembler::Assembler::isLastReturn(this_00);
    if (!bVar3) {
      pIVar13 = MethodAssembler::Assembler::getLastInstruction(this_00);
      if (pIVar13 == pIVar12) {
        MethodAssembler::Assembler::blockReturnNil(this_00);
      }
      else {
        MethodAssembler::Assembler::blockReturnTop(this_00);
      }
    }
    MethodAssembler::Assembler::putLabel(this_00,blockEnd);
    this->localContext = this_01;
    if (arraySize != 0) {
      this->temporalVectorCount = this->temporalVectorCount + -1;
    }
    return (Oop)&NilObject;
  }
  pSVar6 = AST::BlockExpression::getBody(node);
  OVar7.field_0._0_4_ = (*(pSVar6->super_Node)._vptr_Node[2])(pSVar6,this);
  OVar7.field_0.uintValue._4_4_ = extraout_var;
  return (Oop)OVar7.field_0;
}

Assistant:

Oop MethodCompiler::visitBlockExpression(BlockExpression *node)
{
    if(node->isInlined())
    {
        // Visit the method body
        return node->getBody()->acceptVisitor(this);
    }

    // Store the local context
    auto oldLocalContext = localContext;
    localContext = node;

    auto blockEnd = gen.makeLabel();

    // Process the arguments
    auto argumentList = node->getArgumentList();
    size_t argumentCount = 0;
    if(argumentList)
        argumentCount = argumentList->getArguments().size();

    // Count the captured variables.
    auto &blockLocals = node->getLocalVariables();
    auto capturedCount = 0;
    for(size_t i = 0; i < blockLocals.size(); ++i)
    {
        auto &localVar = blockLocals[i];
        if(localVar->isCapturedInClosure())
        {
            localVar->setTemporalVectorIndex(temporalVectorCount);
            localVar->setTemporalIndex(capturedCount++);
        }
    }

    // Push the captured temporal vectors.
    size_t numCopied = temporalVectorCount;
    size_t numLocals = 0;
    if(temporalVectorCount)
    {
        auto oldArgumentCount = oldLocalContext->getArgumentCount();
        for(auto i = 0; i < temporalVectorCount; ++i)
            gen.pushTemporal(int(oldArgumentCount + i));

    }

    if(capturedCount)
    {
        ++temporalVectorCount;

        // Reserve space for the inner temporal vector.
        ++numLocals;
        ++numCopied;
    }

    // Prepare the local variables of the block.
    for(size_t i = 0; i < blockLocals.size(); ++i)
    {
        auto &localVar = blockLocals[i];
        if(localVar->isCapturedInClosure())
            continue;

        if(i < argumentCount)
        {
            localVar->setTemporalIndex((int)i);
        }
        else
        {
            localVar->setTemporalIndex(int(argumentCount + numCopied));
            ++numLocals;
            ++numCopied;
        }
    }

    // Reserve space for the locals.
    if(numLocals)
        gen.pushNClosureTemps((int)numLocals);

    // Push the block.
    gen.pushClosure((int)numCopied, (int)argumentCount, blockEnd, 0);

    // Generate the inner temporal vector.
    if(capturedCount)
    {
        gen.pushNewArray(capturedCount);
        gen.popStoreTemporal(int(argumentCount + temporalVectorCount - 1));

        // Copy the captured arguments into the temp vector
        for(size_t i = 0; i < argumentCount; ++i)
        {
            auto &localVar = blockLocals[i];
            if(localVar->isCapturedInClosure())
            {
                gen.pushTemporal((int)i);
                gen.popStoreTemporalInVector(localVar->getTemporalIndex(), localVar->getTemporalVectorIndex());
            }
        }
    }

    auto closureBeginInstruction = gen.getLastInstruction();

    // Generate the block body.
    node->getBody()->acceptVisitor(this);

    // Always return
	if(!gen.isLastReturn())
    {
        if(gen.getLastInstruction() == closureBeginInstruction)
            gen.blockReturnNil();
        else
            gen.blockReturnTop();
    }

    // Finish the block.
    gen.putLabel(blockEnd);

    // Restore the local context
    localContext = oldLocalContext;

    if(capturedCount)
        --temporalVectorCount;

	return Oop();
}